

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_api.c
# Opt level: O0

MPP_RET hal_h263d_init(void *hal,MppHalCfg *cfg)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  uint local_34;
  RK_U32 hw_flag;
  VpuHwMode hw_mode;
  hal_h263_ctx *p_hal;
  MppHalApi *p_api;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  local_34 = 0;
  mpp_env_get_u32("h263d_hal_debug",&h263d_hal_debug,0);
  memset(hal,0,0x90);
  *(MppBufSlots *)((long)hal + 0x58) = cfg->frame_slots;
  *(MppBufSlots *)((long)hal + 0x60) = cfg->packet_slots;
  RVar1 = mpp_get_vcodec_type();
  if ((RVar1 & 2) != 0) {
    local_34 = 4;
  }
  if ((RVar1 & 1) != 0) {
    local_34 = 2;
  }
  if (local_34 == 2) {
    _mpp_log_l(4,(char *)0x0,"the VDPU1_MODE is used currently!\n",(char *)0x0);
    *(code **)((long)hal + 0x18) = hal_vpu1_h263d_init;
    *(code **)((long)hal + 0x20) = hal_vpu1_h263d_deinit;
    *(code **)((long)hal + 0x28) = hal_vpu1_h263d_gen_regs;
    *(code **)((long)hal + 0x30) = hal_vpu1_h263d_start;
    *(code **)((long)hal + 0x38) = hal_vpu1_h263d_wait;
    *(undefined8 *)((long)hal + 0x40) = 0;
    *(undefined8 *)((long)hal + 0x48) = 0;
    *(undefined8 *)((long)hal + 0x50) = 0;
  }
  else {
    if (local_34 != 4) {
      _mpp_log_l(2,(char *)0x0,"unknow vpu type:%d.",(char *)0x0,(ulong)local_34);
      return MPP_ERR_INIT;
    }
    _mpp_log_l(4,(char *)0x0,"the VDPU2_MODE is used currently!\n",(char *)0x0);
    *(code **)((long)hal + 0x18) = hal_vpu2_h263d_init;
    *(code **)((long)hal + 0x20) = hal_vpu2_h263d_deinit;
    *(code **)((long)hal + 0x28) = hal_vpu2_h263d_gen_regs;
    *(code **)((long)hal + 0x30) = hal_vpu2_h263d_start;
    *(code **)((long)hal + 0x38) = hal_vpu2_h263d_wait;
    *(undefined8 *)((long)hal + 0x40) = 0;
    *(undefined8 *)((long)hal + 0x48) = 0;
    *(undefined8 *)((long)hal + 0x50) = 0;
  }
  MVar2 = (**(code **)((long)hal + 0x18))(hal,cfg);
  return MVar2;
}

Assistant:

static MPP_RET hal_h263d_init(void *hal, MppHalCfg *cfg)
{
    MppHalApi *p_api = NULL;
    hal_h263_ctx *p_hal = (hal_h263_ctx *)hal;
    VpuHwMode hw_mode = MODE_NULL;
    RK_U32 hw_flag = 0;

    mpp_env_get_u32("h263d_hal_debug", &h263d_hal_debug, 0);

    memset(p_hal, 0, sizeof(hal_h263_ctx));
    p_api = &p_hal->hal_api;

    p_hal->frm_slots = cfg->frame_slots;
    p_hal->pkt_slots = cfg->packet_slots;

    hw_flag = mpp_get_vcodec_type();
    if (hw_flag & HAVE_VDPU2)
        hw_mode = VDPU2_MODE;
    if (hw_flag & HAVE_VDPU1)
        hw_mode = VDPU1_MODE;

    switch (hw_mode) {
    case VDPU2_MODE : {
        mpp_log("the VDPU2_MODE is used currently!\n");
        p_api->init    = hal_vpu2_h263d_init;
        p_api->deinit  = hal_vpu2_h263d_deinit;
        p_api->reg_gen = hal_vpu2_h263d_gen_regs;
        p_api->start   = hal_vpu2_h263d_start;
        p_api->wait    = hal_vpu2_h263d_wait;
        p_api->reset   = NULL;
        p_api->flush   = NULL;
        p_api->control = NULL;
    } break;
    case VDPU1_MODE : {
        mpp_log("the VDPU1_MODE is used currently!\n");
        p_api->init    = hal_vpu1_h263d_init;
        p_api->deinit  = hal_vpu1_h263d_deinit;
        p_api->reg_gen = hal_vpu1_h263d_gen_regs;
        p_api->start   = hal_vpu1_h263d_start;
        p_api->wait    = hal_vpu1_h263d_wait;
        p_api->reset   = NULL;
        p_api->flush   = NULL;
        p_api->control = NULL;
    } break;
    default : {
        mpp_err("unknow vpu type:%d.", hw_mode);
        return MPP_ERR_INIT;
    } break;
    }

    return p_api->init(hal, cfg);
}